

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  stbi__uint32 *y_00;
  int *comp_00;
  anon_struct_96_18_0d0905d3 *paVar1;
  uchar uVar2;
  undefined1 uVar3;
  short sVar4;
  ushort uVar5;
  double dVar6;
  long lVar7;
  short sVar8;
  bool bVar9;
  stbi_uc sVar10;
  stbi_uc sVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  int iVar17;
  stbi__uint32 sVar18;
  uint uVar19;
  stbi__uint32 sVar20;
  int iVar21;
  stbi_uc asVar22 [4];
  stbi__uint32 sVar23;
  uint uVar24;
  uint uVar25;
  int iVar26;
  uint uVar27;
  char *pcVar28;
  void *pvVar29;
  stbi__context *psVar30;
  stbi__jpeg *psVar31;
  stbi__uint16 *psVar32;
  stbi_uc *psVar33;
  long lVar34;
  uchar *puVar35;
  code *pcVar36;
  undefined8 uVar37;
  long lVar38;
  short sVar39;
  int iVar40;
  int iVar41;
  ulong uVar42;
  int id;
  ulong uVar43;
  stbi__context *psVar44;
  int iVar45;
  undefined1 *puVar46;
  undefined4 in_register_00000084;
  anon_struct_96_18_0d0905d3 *paVar47;
  byte *pbVar48;
  stbi__result_info *ri_00;
  float *pfVar49;
  int iVar50;
  uint uVar51;
  void *pvVar52;
  int iVar53;
  ulong uVar54;
  int iVar55;
  uint uVar56;
  stbi_uc *psVar57;
  short *psVar58;
  stbi_uc *psVar59;
  long in_FS_OFFSET;
  bool bVar60;
  float fVar61;
  float fVar62;
  undefined1 auVar63 [16];
  stbi__uint16 *local_8980;
  float *local_8978;
  float *local_8968;
  uint local_8958;
  uint local_8940;
  uint local_8900;
  uint local_88fc;
  stbi_uc value [4];
  int iStack_88f4;
  int iStack_88f0;
  uint uStack_88ec;
  uint local_88e8;
  uint uStack_88e4;
  uint uStack_88e0;
  int local_88d8;
  uint local_88cc;
  stbi_uc pal [256] [4];
  
  psVar59 = (stbi_uc *)CONCAT44(in_register_00000084,req_comp);
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  ri->channel_order = 0;
  ri_00 = ri;
  iVar17 = stbi__check_png_header(s);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  if (iVar17 != 0) {
    if ((uint)req_comp < 5) {
      pal._0_8_ = s;
      iVar17 = stbi__parse_png_file((stbi__png *)pal,0,req_comp);
      uVar37 = pal._0_8_;
      if (iVar17 == 0) {
        psVar30 = (stbi__context *)0x0;
      }
      else {
        if ((int)pal[8] < 9) {
          iVar17 = 8;
        }
        else {
          if (pal[8] != (stbi_uc  [4])0x10) {
            pcVar28 = "PNG not supported: unsupported color depth";
            goto LAB_0017df0b;
          }
          iVar17 = 0x10;
        }
        ri->bits_per_channel = iVar17;
        psVar30 = (stbi__context *)pal._24_8_;
        if ((req_comp != 0) && (iVar17 = *(int *)(pal._0_8_ + 0xc), iVar17 != req_comp)) {
          if ((int)pal[8] < 9) {
            psVar30 = (stbi__context *)
                      stbi__convert_format
                                ((uchar *)pal._24_8_,iVar17,req_comp,*(uint *)pal._0_8_,
                                 *(uint *)(pal._0_8_ + 4));
          }
          else {
            psVar30 = (stbi__context *)
                      stbi__convert_format16
                                ((stbi__uint16 *)pal._24_8_,iVar17,req_comp,*(uint *)pal._0_8_,
                                 *(uint *)(pal._0_8_ + 4));
          }
          *(int *)(uVar37 + 0xc) = req_comp;
          if (psVar30 == (stbi__context *)0x0) {
            return (void *)0x0;
          }
        }
        *x = *(int *)uVar37;
        *y = *(int *)(uVar37 + 4);
        if (comp != (int *)0x0) {
          *comp = *(int *)(uVar37 + 8);
        }
        pal._24_8_ = (void *)0x0;
      }
      free((void *)pal._24_8_);
      free((void *)pal._16_8_);
      psVar31 = (stbi__jpeg *)pal._8_8_;
      goto LAB_0017e2e5;
    }
    pcVar28 = "Internal error";
    goto LAB_0017df0b;
  }
  sVar10 = stbi__get8(s);
  if ((sVar10 == 'B') && (sVar10 = stbi__get8(s), sVar10 == 'M')) {
    stbi__get32le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get32le(s);
    sVar18 = stbi__get32le(s);
    if (((0x38 < sVar18) || ((0x100010000001000U >> ((ulong)sVar18 & 0x3f) & 1) == 0)) &&
       ((sVar18 != 0x7c && (sVar18 != 0x6c)))) goto LAB_0017e091;
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    pvVar29 = stbi__bmp_parse_header(s,(stbi__bmp_data *)value);
    if (pvVar29 == (void *)0x0) {
      return (void *)0x0;
    }
    uVar19 = s->img_y;
    uVar24 = -uVar19;
    if (0 < (int)uVar19) {
      uVar24 = uVar19;
    }
    s->img_y = uVar24;
    if ((uVar24 < 0x1000001) && (s->img_x < 0x1000001)) {
      local_8940 = 0xff;
      if (iStack_88f0 != 0xc) {
        if ((int)value < 0x10) {
          uVar24 = iStack_88f4 - (local_88d8 + iStack_88f0) >> 2;
          goto LAB_0017eaca;
        }
LAB_0017ebf8:
        iVar17 = (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original) +
                 s->callback_already_read;
        if (((0xfffffbff < iVar17 - 0x401U) && (iVar17 <= iStack_88f4)) &&
           (iStack_88f4 - iVar17 < 0x401)) {
          stbi__skip(s,iStack_88f4 - iVar17);
          uVar24 = 0;
          bVar60 = true;
          if (value != (stbi_uc  [4])0x18 || uStack_88e0 != 0xff000000) goto LAB_0017eaef;
          bVar9 = true;
          iVar17 = 3;
          asVar22[0] = '\x18';
          asVar22[1] = '\0';
          asVar22[2] = '\0';
          asVar22[3] = '\0';
          bVar60 = true;
          goto LAB_0017eb15;
        }
LAB_0017fd37:
        pcVar28 = "Corrupt BMP";
        goto LAB_0017df0b;
      }
      if (0x17 < (int)value) goto LAB_0017ebf8;
      uVar24 = ((iStack_88f4 - local_88d8) + -0x18) / 3;
LAB_0017eaca:
      if (uVar24 == 0) goto LAB_0017ebf8;
      bVar60 = false;
LAB_0017eaef:
      bVar9 = uStack_88e0 == 0xff000000;
      iVar17 = 4 - (uint)(uStack_88e0 == 0);
      asVar22 = value;
LAB_0017eb15:
      s->img_n = iVar17;
      if (2 < req_comp) {
        iVar17 = req_comp;
      }
      sVar18 = s->img_x;
      sVar20 = s->img_y;
      iVar21 = stbi__mad3sizes_valid(iVar17,sVar18,sVar20,0);
      if (iVar21 == 0) goto LAB_0017fd37;
      puVar35 = (uchar *)stbi__malloc_mad3(iVar17,sVar18,sVar20,0);
      if (puVar35 != (uchar *)0x0) {
        if ((int)asVar22 < 0x10) {
          if (!bVar60 && (int)uVar24 < 0x101) {
            uVar42 = 0;
            uVar54 = 0;
            if (0 < (int)uVar24) {
              uVar54 = (ulong)uVar24;
            }
            for (; uVar54 != uVar42; uVar42 = uVar42 + 1) {
              sVar10 = stbi__get8(s);
              pal[uVar42][2] = sVar10;
              sVar10 = stbi__get8(s);
              pal[uVar42][1] = sVar10;
              sVar10 = stbi__get8(s);
              pal[uVar42][0] = sVar10;
              if (iStack_88f0 != 0xc) {
                stbi__get8(s);
              }
              pal[uVar42][3] = 0xff;
            }
            stbi__skip(s,(uVar24 * (iStack_88f0 == 0xc | 0xfffffffc) + iStack_88f4) -
                         (iStack_88f0 + local_88d8));
            if (asVar22 == (stbi_uc  [4])0x1) {
              sVar20 = s->img_x;
              iVar21 = 0;
              uVar24 = 0;
LAB_00180292:
              uVar42 = (ulong)uVar24;
              sVar18 = s->img_y;
              if (iVar21 < (int)sVar18) {
                iVar41 = 0;
                do {
                  bVar16 = stbi__get8(s);
                  sVar18 = s->img_x;
                  iVar40 = 8;
                  do {
                    uVar24 = (uint)uVar42;
                    if ((int)sVar18 <= iVar41) {
LAB_0018032a:
                      stbi__skip(s,-(sVar20 + 7 >> 3) & 3);
                      iVar21 = iVar21 + 1;
                      goto LAB_00180292;
                    }
                    bVar60 = (bVar16 >> (iVar40 - 1U & 0x1f) & 1) != 0;
                    lVar38 = (long)(int)uVar24;
                    uVar42 = lVar38 + 3;
                    puVar35[lVar38] = pal[bVar60][0];
                    puVar35[lVar38 + 1] = pal[bVar60][1];
                    puVar35[lVar38 + 2] = pal[bVar60][2];
                    if (iVar17 == 4) {
                      puVar35[lVar38 + 3] = 0xff;
                      uVar42 = (ulong)(uVar24 + 4);
                    }
                    if (sVar18 - 1 == iVar41) {
                      uVar24 = (uint)uVar42;
                      goto LAB_0018032a;
                    }
                    iVar41 = iVar41 + 1;
                    iVar45 = iVar40 + -1;
                    bVar60 = 0 < iVar40;
                    iVar40 = iVar45;
                  } while (iVar45 != 0 && bVar60);
                } while( true );
              }
              goto LAB_0018003f;
            }
            if (asVar22 == (stbi_uc  [4])0x8) {
              uVar24 = s->img_x;
            }
            else {
              if (asVar22 != (stbi_uc  [4])0x4) goto LAB_0017fd32;
              uVar24 = s->img_x + 1 >> 1;
            }
            local_8958 = -uVar24 & 3;
            uVar42 = 0;
            for (iVar21 = 0; sVar18 = s->img_y, iVar21 < (int)sVar18; iVar21 = iVar21 + 1) {
              for (iVar41 = 0; iVar41 < (int)s->img_x; iVar41 = iVar41 + 2) {
                bVar16 = stbi__get8(s);
                uVar27 = bVar16 & 0xf;
                uVar24 = (uint)(bVar16 >> 4);
                if (asVar22 != (stbi_uc  [4])0x4) {
                  uVar24 = (uint)bVar16;
                }
                if (asVar22 != (stbi_uc  [4])0x4) {
                  uVar27 = 0;
                }
                lVar38 = (long)(int)uVar42;
                uVar54 = lVar38 + 3;
                puVar35[lVar38] = pal[uVar24][0];
                puVar35[lVar38 + 1] = pal[uVar24][1];
                puVar35[lVar38 + 2] = pal[uVar24][2];
                if (iVar17 == 4) {
                  puVar35[lVar38 + 3] = 0xff;
                  uVar54 = (ulong)((int)uVar42 + 4);
                }
                if (iVar41 + 1U == s->img_x) {
                  uVar42 = uVar54 & 0xffffffff;
                  break;
                }
                if (asVar22 == (stbi_uc  [4])0x8) {
                  bVar16 = stbi__get8(s);
                  uVar27 = (uint)bVar16;
                }
                lVar38 = (long)(int)uVar54;
                uVar42 = lVar38 + 3;
                puVar35[lVar38] = pal[uVar27][0];
                puVar35[lVar38 + 1] = pal[uVar27][1];
                puVar35[lVar38 + 2] = pal[uVar27][2];
                if (iVar17 == 4) {
                  puVar35[lVar38 + 3] = 0xff;
                  uVar42 = (ulong)((int)uVar54 + 4);
                }
              }
              stbi__skip(s,local_8958);
            }
            goto LAB_0018003f;
          }
        }
        else {
          stbi__skip(s,iStack_88f4 - (iStack_88f0 + local_88d8));
          if (asVar22 != (stbi_uc  [4])0x10) {
            if (asVar22 == (stbi_uc  [4])0x20) {
              local_88fc = 0;
              if (!(bool)(bVar9 & (uStack_88ec == 0xff0000 &&
                                  (local_88e8 == 0xff00 && uStack_88e4 == 0xff))))
              goto LAB_0017fc4f;
              bVar60 = true;
            }
            else {
              local_88fc = 0;
              if (asVar22 != (stbi_uc  [4])0x18) goto LAB_0017fc4f;
              local_88fc = s->img_x & 3;
              bVar60 = false;
            }
            bVar9 = false;
            iVar21 = 0;
            iVar45 = 0;
            iVar41 = 0;
            iVar40 = 0;
            uVar24 = 0;
            uVar27 = 0;
            local_8900 = 0;
            local_88cc = 0;
LAB_0017fe6f:
            iVar55 = 0;
            for (iVar50 = 0; sVar18 = s->img_y, iVar50 < (int)sVar18; iVar50 = iVar50 + 1) {
              if (bVar9) {
                for (iVar53 = 0; iVar53 < (int)s->img_x; iVar53 = iVar53 + 1) {
                  if (asVar22 == (stbi_uc  [4])0x10) {
                    uVar25 = stbi__get16le(s);
                  }
                  else {
                    uVar25 = stbi__get32le(s);
                  }
                  iVar26 = stbi__shiftsigned(uVar25 & uStack_88ec,iVar21,uVar24);
                  puVar35[iVar55] = (uchar)iVar26;
                  iVar26 = stbi__shiftsigned(uVar25 & local_88e8,iVar45,uVar27);
                  puVar35[(long)iVar55 + 1] = (uchar)iVar26;
                  iVar26 = stbi__shiftsigned(uVar25 & uStack_88e4,iVar41,local_8900);
                  puVar35[(long)iVar55 + 2] = (uchar)iVar26;
                  if (uStack_88e0 == 0) {
                    uVar25 = 0xff;
                  }
                  else {
                    uVar25 = stbi__shiftsigned(uVar25 & uStack_88e0,iVar40,local_88cc);
                  }
                  iVar26 = iVar55 + 3;
                  if (iVar17 == 4) {
                    puVar35[(long)iVar55 + 3] = (uchar)uVar25;
                    iVar26 = iVar55 + 4;
                  }
                  iVar55 = iVar26;
                  local_8940 = local_8940 | uVar25;
                }
              }
              else {
                for (iVar53 = 0; iVar53 < (int)s->img_x; iVar53 = iVar53 + 1) {
                  sVar10 = stbi__get8(s);
                  puVar35[(long)iVar55 + 2] = sVar10;
                  sVar10 = stbi__get8(s);
                  puVar35[(long)iVar55 + 1] = sVar10;
                  sVar10 = stbi__get8(s);
                  puVar35[iVar55] = sVar10;
                  bVar16 = 0xff;
                  if (bVar60) {
                    bVar16 = stbi__get8(s);
                  }
                  iVar26 = iVar55 + 3;
                  if (iVar17 == 4) {
                    puVar35[(long)iVar55 + 3] = bVar16;
                    iVar26 = iVar55 + 4;
                  }
                  iVar55 = iVar26;
                  local_8940 = local_8940 | bVar16;
                }
              }
              stbi__skip(s,local_88fc);
            }
LAB_0018003f:
            if ((iVar17 == 4) && (local_8940 == 0)) {
              for (uVar24 = s->img_x * sVar18 * 4 - 1; -1 < (int)uVar24; uVar24 = uVar24 - 4) {
                puVar35[uVar24] = 0xff;
              }
            }
            if (0 < (int)uVar19) {
              iVar21 = (int)sVar18 >> 1;
              if ((int)sVar18 >> 1 < 1) {
                iVar21 = 0;
              }
              iVar40 = (sVar18 - 1) * iVar17;
              iVar41 = 0;
              for (iVar45 = 0; iVar45 != iVar21; iVar45 = iVar45 + 1) {
                sVar20 = s->img_x;
                uVar19 = sVar20 * iVar17;
                if ((int)(sVar20 * iVar17) < 1) {
                  uVar19 = 0;
                }
                for (uVar42 = 0; uVar19 != uVar42; uVar42 = uVar42 + 1) {
                  uVar2 = puVar35[uVar42 + sVar20 * iVar41];
                  puVar35[uVar42 + sVar20 * iVar41] = puVar35[uVar42 + sVar20 * iVar40];
                  puVar35[uVar42 + sVar20 * iVar40] = uVar2;
                }
                iVar40 = iVar40 - iVar17;
                iVar41 = iVar41 + iVar17;
              }
            }
            uVar19 = s->img_x;
            if ((req_comp != 0) && (iVar17 != req_comp)) {
              puVar35 = stbi__convert_format(puVar35,iVar17,req_comp,uVar19,sVar18);
              if (puVar35 == (uchar *)0x0) {
                return (void *)0x0;
              }
              uVar19 = s->img_x;
            }
            *x = uVar19;
            *y = s->img_y;
            if (comp != (int *)0x0) {
              *comp = s->img_n;
              return puVar35;
            }
            return puVar35;
          }
          local_88fc = s->img_x * 2 & 2;
LAB_0017fc4f:
          if ((local_88e8 != 0 && uStack_88ec != 0) && uStack_88e4 != 0) {
            iVar21 = stbi__high_bit(uStack_88ec);
            uVar24 = stbi__bitcount(uStack_88ec);
            iVar45 = stbi__high_bit(local_88e8);
            uVar27 = stbi__bitcount(local_88e8);
            iVar41 = stbi__high_bit(uStack_88e4);
            local_8900 = stbi__bitcount(uStack_88e4);
            iVar40 = stbi__high_bit(uStack_88e0);
            local_88cc = stbi__bitcount(uStack_88e0);
            if ((local_88cc < 9 && local_8900 < 9) && (uVar27 < 9 && uVar24 < 9)) {
              iVar21 = iVar21 + -7;
              iVar45 = iVar45 + -7;
              iVar41 = iVar41 + -7;
              iVar40 = iVar40 + -7;
              bVar9 = true;
              bVar60 = false;
              goto LAB_0017fe6f;
            }
          }
        }
LAB_0017fd32:
        free(puVar35);
        goto LAB_0017fd37;
      }
      goto LAB_0017f98e;
    }
LAB_0017ea99:
    pcVar28 = "Very large image (corrupt?)";
    goto LAB_0017df0b;
  }
LAB_0017e091:
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  iVar17 = stbi__gif_test(s);
  if (iVar17 != 0) {
    memset((stbi__gif *)pal,0,0x8870);
    psVar30 = (stbi__context *)stbi__gif_load_next(s,(stbi__gif *)pal,comp,0,psVar59);
    if (psVar30 == (stbi__context *)0x0 || psVar30 == s) {
      free((void *)pal._8_8_);
      psVar30 = (stbi__context *)0x0;
    }
    else {
      *x = (int)pal[0];
      *y = (int)pal[1];
      if ((req_comp & 0xfffffffbU) != 0) {
        psVar30 = (stbi__context *)
                  stbi__convert_format((uchar *)psVar30,4,req_comp,(uint)pal[0],(uint)pal[1]);
      }
    }
    free((void *)pal._24_8_);
    psVar31 = (stbi__jpeg *)pal._16_8_;
    goto LAB_0017e2e5;
  }
  sVar18 = stbi__get32be(s);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  if (sVar18 == 0x38425053) {
    sVar18 = stbi__get32be(s);
    if (sVar18 != 0x38425053) {
      pcVar28 = "Corrupt PSD image";
      goto LAB_0017df0b;
    }
    iVar17 = stbi__get16be(s);
    if (iVar17 != 1) {
      pcVar28 = "Unsupported version of PSD image";
      goto LAB_0017df0b;
    }
    stbi__skip(s,6);
    uVar19 = stbi__get16be(s);
    if (0x10 < uVar19) {
      pcVar28 = "Unsupported number of channels in PSD image";
      goto LAB_0017df0b;
    }
    sVar18 = stbi__get32be(s);
    sVar20 = stbi__get32be(s);
    if ((0x1000000 < (int)sVar18) || (0x1000000 < (int)sVar20)) goto LAB_0017ea99;
    uVar24 = stbi__get16be(s);
    if (((short)uVar24 != 8) && ((uVar24 & 0xffff) != 0x10)) {
      pcVar28 = "PSD bit depth is not 8 or 16 bit";
      goto LAB_0017df0b;
    }
    iVar17 = stbi__get16be(s);
    if (iVar17 != 3) {
      pcVar28 = "PSD is not in RGB color format";
      goto LAB_0017df0b;
    }
    sVar23 = stbi__get32be(s);
    stbi__skip(s,sVar23);
    sVar23 = stbi__get32be(s);
    stbi__skip(s,sVar23);
    sVar23 = stbi__get32be(s);
    stbi__skip(s,sVar23);
    uVar27 = stbi__get16be(s);
    if (1 < uVar27) {
      pcVar28 = "PSD has an unknown compression format";
      goto LAB_0017df0b;
    }
    iVar17 = stbi__mad3sizes_valid(4,sVar20,sVar18,0);
    if (iVar17 == 0) {
      pcVar28 = "Corrupt PSD";
      goto LAB_0017df0b;
    }
    if (((bpc == 0x10) && (uVar24 == 0x10)) && (uVar27 == 0)) {
      local_8978 = (float *)stbi__malloc_mad3(8,sVar20,sVar18,0);
      ri->bits_per_channel = 0x10;
    }
    else {
      local_8978 = (float *)malloc((long)(int)(sVar18 * sVar20 * 4));
    }
    if (local_8978 != (float *)0x0) {
      uVar25 = sVar20 * sVar18;
      if (uVar27 == 0) {
        uVar42 = 0;
        psVar32 = (stbi__uint16 *)local_8978;
        local_8980 = (stbi__uint16 *)local_8978;
        uVar27 = 0;
        if (0 < (int)uVar25) {
          uVar27 = uVar25;
        }
        for (; uVar42 != 4; uVar42 = uVar42 + 1) {
          if (uVar42 < uVar19) {
            if (ri->bits_per_channel == 0x10) {
              for (lVar38 = 0; uVar27 != (uint)lVar38; lVar38 = lVar38 + 1) {
                iVar17 = stbi__get16be(s);
                local_8980[lVar38 * 4] = (stbi__uint16)iVar17;
              }
            }
            else {
              lVar38 = 0;
              if (uVar24 == 0x10) {
                for (; uVar27 != (uint)lVar38; lVar38 = lVar38 + 1) {
                  iVar17 = stbi__get16be(s);
                  *(char *)(psVar32 + lVar38 * 2) = (char)((uint)iVar17 >> 8);
                }
              }
              else {
                for (; uVar27 != (uint)lVar38; lVar38 = lVar38 + 1) {
                  sVar10 = stbi__get8(s);
                  *(stbi_uc *)(psVar32 + lVar38 * 2) = sVar10;
                }
              }
            }
          }
          else if (uVar24 == 0x10 && bpc == 0x10) {
            for (lVar38 = 0; uVar27 != (uint)lVar38; lVar38 = lVar38 + 1) {
              local_8980[lVar38 * 4] = -(ushort)(uVar42 == 3);
            }
          }
          else {
            for (lVar38 = 0; uVar27 != (uint)lVar38; lVar38 = lVar38 + 1) {
              *(char *)(psVar32 + lVar38 * 2) = -(uVar42 == 3);
            }
          }
          psVar32 = (stbi__uint16 *)((long)psVar32 + 1);
          local_8980 = local_8980 + 1;
        }
      }
      else {
        stbi__skip(s,sVar18 * uVar19 * 2);
        uVar42 = 0;
        psVar32 = (stbi__uint16 *)local_8978;
        uVar24 = 0;
        if (0 < (int)uVar25) {
          uVar24 = uVar25;
        }
        for (; uVar42 != 4; uVar42 = uVar42 + 1) {
          if (uVar42 < uVar19) {
            psVar59 = (stbi_uc *)((long)local_8978 + uVar42);
            iVar17 = 0;
            do {
              uVar27 = uVar25 - iVar17;
              do {
                if ((int)uVar27 < 1) goto LAB_0018052b;
                bVar16 = stbi__get8(s);
              } while (bVar16 == 0x80);
              uVar56 = (uint)bVar16;
              if ((char)bVar16 < '\0') {
                uVar51 = 0x101 - uVar56;
                if (uVar27 < uVar51) goto LAB_00180b8a;
                sVar10 = stbi__get8(s);
                for (iVar21 = uVar56 - 0x101; iVar21 != 0; iVar21 = iVar21 + 1) {
                  *psVar59 = sVar10;
                  psVar59 = psVar59 + 4;
                }
              }
              else {
                if (uVar27 <= bVar16) {
LAB_00180b8a:
                  free(local_8978);
                  pcVar28 = "bad RLE data";
                  goto LAB_0017df0b;
                }
                uVar51 = uVar56 + 1;
                uVar27 = uVar51;
                while (bVar60 = uVar27 != 0, uVar27 = uVar27 - 1, bVar60) {
                  sVar10 = stbi__get8(s);
                  *psVar59 = sVar10;
                  psVar59 = psVar59 + 4;
                }
              }
              iVar17 = iVar17 + uVar51;
            } while( true );
          }
          for (lVar38 = 0; uVar24 != (uint)lVar38; lVar38 = lVar38 + 1) {
            *(char *)(psVar32 + lVar38 * 2) = -(uVar42 == 3);
          }
LAB_0018052b:
          psVar32 = (stbi__uint16 *)((long)psVar32 + 1);
        }
      }
      if (3 < uVar19) {
        uVar42 = 0;
        if (0 < (int)uVar25) {
          uVar42 = (ulong)uVar25;
        }
        if (ri->bits_per_channel == 0x10) {
          for (uVar54 = 0; uVar42 != uVar54; uVar54 = uVar54 + 1) {
            uVar5 = *(ushort *)((long)local_8978 + (uVar54 * 4 + 3) * 2);
            if ((uVar5 != 0) && (uVar5 != 0xffff)) {
              fVar62 = 1.0 / ((float)uVar5 / 65535.0);
              fVar61 = (1.0 - fVar62) * 65535.0;
              auVar63._0_4_ =
                   (int)(fVar61 + fVar62 * (float)(*(uint *)((long)local_8978 + uVar54 * 4 * 2) &
                                                  0xffff));
              auVar63._4_4_ =
                   (int)(fVar61 + fVar62 * (float)(*(uint *)((long)local_8978 + uVar54 * 4 * 2) >>
                                                  0x10));
              auVar63._8_4_ = (int)(fVar61 + fVar62 * 0.0);
              auVar63._12_4_ = (int)(fVar61 + fVar62 * 0.0);
              auVar63 = pshuflw(auVar63,auVar63,0xe8);
              *(int *)((long)local_8978 + uVar54 * 4 * 2) = auVar63._0_4_;
              *(stbi__uint16 *)((long)local_8978 + (uVar54 * 4 + 2) * 2) =
                   (stbi__uint16)
                   (int)((float)*(ushort *)((long)local_8978 + (uVar54 * 4 + 2) * 2) * fVar62 +
                        fVar61);
            }
          }
        }
        else {
          for (uVar54 = 0; uVar42 != uVar54; uVar54 = uVar54 + 1) {
            bVar16 = *(byte *)((long)local_8978 + uVar54 * 4 + 3);
            if ((bVar16 != 0) && (bVar16 != 0xff)) {
              fVar62 = 1.0 / ((float)bVar16 / 255.0);
              fVar61 = (1.0 - fVar62) * 255.0;
              *(char *)((long)local_8978 + uVar54 * 2 * 2) =
                   (char)(int)((float)(byte)*(stbi__uint16 *)((long)local_8978 + uVar54 * 2 * 2) *
                               fVar62 + fVar61);
              *(char *)((long)local_8978 + uVar54 * 4 + 1) =
                   (char)(int)((float)*(byte *)((long)local_8978 + uVar54 * 4 + 1) * fVar62 + fVar61
                              );
              *(char *)((long)local_8978 + (uVar54 * 2 + 1) * 2) =
                   (char)(int)((float)(byte)*(stbi__uint16 *)
                                             ((long)local_8978 + (uVar54 * 2 + 1) * 2) * fVar62 +
                              fVar61);
            }
          }
        }
      }
      if ((req_comp & 0xfffffffbU) != 0) {
        if (ri->bits_per_channel == 0x10) {
          local_8978 = (float *)stbi__convert_format16
                                          ((stbi__uint16 *)local_8978,4,req_comp,sVar20,sVar18);
        }
        else {
          local_8978 = (float *)stbi__convert_format((uchar *)local_8978,4,req_comp,sVar20,sVar18);
        }
        if (local_8978 == (float *)0x0) {
          return (void *)0x0;
        }
      }
      if (comp != (int *)0x0) {
        *comp = 4;
      }
      *y = sVar18;
      *x = sVar20;
      return (stbi__uint16 *)local_8978;
    }
  }
  else {
    iVar17 = stbi__pic_is4(s,anon_var_dwarf_40e11);
    iVar21 = (int)psVar59;
    if (iVar17 == 0) {
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
    }
    else {
      iVar17 = 0x54;
      while( true ) {
        iVar21 = (int)psVar59;
        bVar60 = iVar17 == 0;
        iVar17 = iVar17 + -1;
        if (bVar60) break;
        stbi__get8(s);
      }
      iVar17 = stbi__pic_is4(s,"PICT");
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      if (iVar17 != 0) {
        iVar17 = 0x5c;
        while (bVar60 = iVar17 != 0, iVar17 = iVar17 + -1, bVar60) {
          stbi__get8(s);
        }
        uVar19 = stbi__get16be(s);
        uVar24 = stbi__get16be(s);
        iVar17 = stbi__at_eof(s);
        if (iVar17 != 0) {
          pcVar28 = "file too short (pic header)";
          goto LAB_0017df0b;
        }
        iVar17 = stbi__mad3sizes_valid(uVar19,uVar24,4,0);
        if (iVar17 == 0) {
          pcVar28 = "PIC image too large to decode";
          goto LAB_0017df0b;
        }
        stbi__get32be(s);
        stbi__get16be(s);
        stbi__get16be(s);
        local_8978 = (float *)stbi__malloc_mad3(uVar19,uVar24,4,0);
        if (local_8978 != (float *)0x0) {
          memset(local_8978,0xff,(ulong)(uVar19 * 4 * uVar24));
          psVar59 = pal[0] + 2;
          lVar38 = 0;
          uVar27 = uVar24;
          uVar25 = 0;
          while( true ) {
            if (lVar38 == 10) {
              *(char **)(in_FS_OFFSET + -0x20) = "too many packets";
              goto LAB_00180371;
            }
            sVar10 = stbi__get8(s);
            bVar16 = stbi__get8(s);
            (*(stbi_uc (*) [4])(psVar59 + -2))[0] = bVar16;
            bVar12 = stbi__get8(s);
            psVar59[-1] = bVar12;
            bVar12 = stbi__get8(s);
            *psVar59 = bVar12;
            iVar17 = stbi__at_eof(s);
            uVar27 = uVar25;
            if (iVar17 != 0) break;
            if (bVar16 != 8) {
              pcVar28 = "packet isn\'t 8bpp";
              goto LAB_0017faa5;
            }
            uVar25 = uVar25 | bVar12;
            psVar59 = psVar59 + 3;
            lVar38 = lVar38 + 1;
            if (sVar10 == '\0') goto code_r0x0017e801;
          }
          pcVar28 = "file too short (reading packets)";
LAB_0017faa5:
          *(char **)(in_FS_OFFSET + -0x20) = pcVar28;
LAB_00180371:
          free(local_8978);
          local_8978 = (float *)0x0;
          goto LAB_00180397;
        }
        goto LAB_0017f98e;
      }
    }
    psVar31 = (stbi__jpeg *)calloc(1,0x4888);
    if (psVar31 == (stbi__jpeg *)0x0) {
      *(char **)(in_FS_OFFSET + -0x20) = "Out of memory";
    }
    else {
      psVar31->s = s;
      psVar31->idct_block_kernel = stbi__idct_simd;
      psVar31->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
      psVar31->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
      iVar17 = stbi__decode_jpeg_header(psVar31,1);
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      free(psVar31);
      if (iVar17 != 0) {
        psVar31 = (stbi__jpeg *)calloc(1,0x4888);
        if (psVar31 != (stbi__jpeg *)0x0) {
          psVar31->s = s;
          psVar31->idct_block_kernel = stbi__idct_simd;
          psVar31->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
          psVar31->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
          s->img_n = 0;
          if ((uint)req_comp < 5) {
            for (lVar38 = 0x46d8; lVar38 != 0x4858; lVar38 = lVar38 + 0x60) {
              psVar59 = psVar31->huff_dc[0].fast + lVar38 + -8;
              psVar59[0] = '\0';
              psVar59[1] = '\0';
              psVar59[2] = '\0';
              psVar59[3] = '\0';
              psVar59[4] = '\0';
              psVar59[5] = '\0';
              psVar59[6] = '\0';
              psVar59[7] = '\0';
              psVar59[8] = '\0';
              psVar59[9] = '\0';
              psVar59[10] = '\0';
              psVar59[0xb] = '\0';
              psVar59[0xc] = '\0';
              psVar59[0xd] = '\0';
              psVar59[0xe] = '\0';
              psVar59[0xf] = '\0';
            }
            psVar31->restart_interval = 0;
            iVar17 = stbi__decode_jpeg_header(psVar31,0);
            if (iVar17 != 0) {
              paVar1 = psVar31->img_comp;
              bVar16 = stbi__get_marker(psVar31);
LAB_0017ed22:
              if (bVar16 == 0xda) {
                iVar17 = stbi__get16be(psVar31->s);
                bVar16 = stbi__get8(psVar31->s);
                uVar19 = (uint)bVar16;
                psVar31->scan_n = (uint)bVar16;
                if ((((byte)(bVar16 - 5) < 0xfc) ||
                    (psVar30 = psVar31->s, psVar30->img_n < (int)(uint)bVar16)) ||
                   (iVar17 != (uint)bVar16 * 2 + 6)) {
LAB_001807b7:
                  pcVar28 = "Corrupt JPEG";
LAB_001807be:
                  *(char **)(in_FS_OFFSET + -0x20) = pcVar28;
                  goto LAB_001807c7;
                }
                lVar38 = 0;
                while( true ) {
                  bVar16 = stbi__get8(psVar30);
                  if ((int)uVar19 <= lVar38) break;
                  bVar12 = stbi__get8(psVar31->s);
                  psVar30 = psVar31->s;
                  uVar19 = psVar30->img_n;
                  uVar42 = 0;
                  if (0 < (int)uVar19) {
                    uVar42 = (ulong)uVar19;
                  }
                  paVar47 = paVar1;
                  for (uVar54 = 0; uVar42 != uVar54; uVar54 = uVar54 + 1) {
                    if (paVar47->id == (uint)bVar16) {
                      uVar42 = uVar54 & 0xffffffff;
                      break;
                    }
                    paVar47 = paVar47 + 1;
                  }
                  if ((uint)uVar42 == uVar19) goto LAB_001807c7;
                  psVar31->img_comp[uVar42].hd = (uint)(bVar12 >> 4);
                  if ((0x3f < bVar12) || (paVar1[uVar42].ha = bVar12 & 0xf, 3 < (bVar12 & 0xf)))
                  goto LAB_001807b7;
                  psVar31->order[lVar38] = (uint)uVar42;
                  lVar38 = lVar38 + 1;
                  uVar19 = psVar31->scan_n;
                }
                psVar31->spec_start = (uint)bVar16;
                bVar16 = stbi__get8(psVar31->s);
                psVar31->spec_end = (uint)bVar16;
                bVar16 = stbi__get8(psVar31->s);
                psVar31->succ_high = (uint)(bVar16 >> 4);
                psVar31->succ_low = bVar16 & 0xf;
                iVar17 = psVar31->spec_start;
                if (psVar31->progressive != 0) {
                  if (((iVar17 < 0x40) && (psVar31->spec_end < 0x40)) &&
                     ((iVar17 <= psVar31->spec_end && ((bVar16 < 0xe0 && ((bVar16 & 0xf) < 0xe))))))
                  goto LAB_0017ef20;
                  goto LAB_001807b7;
                }
                if ((iVar17 != 0) || ((0xf < bVar16 || ((bVar16 & 0xf) != 0)))) goto LAB_001807b7;
                psVar31->spec_end = 0x3f;
LAB_0017ef20:
                stbi__jpeg_reset(psVar31);
                if (psVar31->progressive != 0) {
                  if (psVar31->scan_n == 1) {
                    iVar17 = psVar31->order[0];
                    iVar41 = psVar31->img_comp[iVar17].x + 7 >> 3;
                    iVar21 = psVar31->img_comp[iVar17].y + 7 >> 3;
                    iVar40 = 0;
                    if (iVar41 < 1) {
                      iVar41 = 0;
                    }
                    if (iVar21 < 1) {
                      iVar21 = iVar40;
                    }
                    for (; iVar40 != iVar21; iVar40 = iVar40 + 1) {
                      for (iVar45 = 0; iVar45 != iVar41; iVar45 = iVar45 + 1) {
                        psVar58 = paVar1[iVar17].coeff +
                                  (paVar1[iVar17].coeff_w * iVar40 + iVar45) * 0x40;
                        uVar42 = (ulong)psVar31->spec_start;
                        if (uVar42 == 0) {
                          iVar50 = stbi__jpeg_decode_block_prog_dc
                                             (psVar31,psVar58,
                                              (stbi__huffman *)
                                              psVar31->huff_dc[paVar1[iVar17].hd].fast,iVar17);
                          if (iVar50 == 0) goto LAB_001807c7;
                        }
                        else {
                          iVar50 = paVar1[iVar17].ha;
                          psVar59 = psVar31->huff_ac[iVar50].fast;
                          iVar55 = psVar31->eob_run;
                          bVar16 = (byte)psVar31->succ_low;
                          if (psVar31->succ_high == 0) {
                            if (iVar55 == 0) {
                              do {
                                if (psVar31->code_bits < 0x10) {
                                  stbi__grow_buffer_unsafe(psVar31);
                                }
                                sVar39 = psVar31->fast_ac[iVar50][psVar31->code_buffer >> 0x17];
                                uVar19 = (uint)sVar39;
                                iVar55 = (int)uVar42;
                                if (sVar39 == 0) {
                                  uVar19 = stbi__jpeg_huff_decode(psVar31,(stbi__huffman *)psVar59);
                                  if ((int)uVar19 < 0) goto LAB_001807b7;
                                  uVar24 = uVar19 >> 4;
                                  if ((uVar19 & 0xf) == 0) {
                                    if (uVar19 < 0xf0) {
                                      iVar55 = 1 << ((byte)uVar24 & 0x1f);
                                      psVar31->eob_run = iVar55;
                                      if (0xf < uVar19) {
                                        iVar55 = stbi__jpeg_get_bits(psVar31,uVar24);
                                        iVar55 = iVar55 + psVar31->eob_run;
                                      }
                                      goto LAB_0017f0cd;
                                    }
                                    uVar42 = (ulong)(iVar55 + 0x10);
                                  }
                                  else {
                                    lVar38 = (ulong)uVar24 + (long)iVar55;
                                    uVar42 = (ulong)((int)lVar38 + 1);
                                    bVar12 = ""[lVar38];
                                    iVar55 = stbi__extend_receive(psVar31,uVar19 & 0xf);
                                    psVar58[bVar12] = (short)(iVar55 << (bVar16 & 0x1f));
                                  }
                                }
                                else {
                                  uVar24 = uVar19 & 0xf;
                                  if (psVar31->code_bits < (int)uVar24) {
                                    pcVar28 = "Combined length longer than code bits available";
                                    goto LAB_001807be;
                                  }
                                  lVar38 = (ulong)(uVar19 >> 4 & 0xf) + (long)iVar55;
                                  psVar31->code_buffer = psVar31->code_buffer << (sbyte)uVar24;
                                  psVar31->code_bits = psVar31->code_bits - uVar24;
                                  uVar42 = (ulong)((int)lVar38 + 1);
                                  psVar58[""[lVar38]] = (short)((uVar19 >> 8) << (bVar16 & 0x1f));
                                }
                              } while ((int)uVar42 <= psVar31->spec_end);
                            }
                            else {
LAB_0017f0cd:
                              psVar31->eob_run = iVar55 + -1;
                            }
                          }
                          else if (iVar55 == 0) {
                            iVar50 = 0x10000 << (bVar16 & 0x1f);
                            do {
                              uVar19 = stbi__jpeg_huff_decode(psVar31,(stbi__huffman *)psVar59);
                              if ((int)uVar19 < 0) goto LAB_001807b7;
                              uVar24 = uVar19 >> 4;
                              if ((uVar19 & 0xf) == 1) {
                                iVar55 = stbi__jpeg_get_bit(psVar31);
                                iVar53 = 1;
                                if (iVar55 == 0) {
                                  iVar53 = 0xffff;
                                }
                                sVar39 = (short)(iVar53 << (bVar16 & 0x1f));
                              }
                              else {
                                if ((uVar19 & 0xf) != 0) goto LAB_001807b7;
                                if (uVar19 < 0xf0) {
                                  psVar31->eob_run = ~(-1 << ((byte)uVar24 & 0x1f));
                                  if (0xf < uVar19) {
                                    iVar55 = stbi__jpeg_get_bits(psVar31,uVar24);
                                    psVar31->eob_run = psVar31->eob_run + iVar55;
                                  }
                                  uVar24 = 0x40;
                                }
                                else {
                                  uVar24 = 0xf;
                                }
                                sVar39 = 0;
                              }
                              uVar54 = (long)(int)uVar42;
                              do {
                                while( true ) {
                                  uVar42 = uVar54;
                                  iVar55 = psVar31->spec_end;
                                  if ((long)iVar55 < (long)uVar42) goto LAB_0017f1fc;
                                  bVar12 = ""[uVar42];
                                  if (psVar58[bVar12] == 0) break;
                                  iVar55 = stbi__jpeg_get_bit(psVar31);
                                  if ((iVar55 != 0) &&
                                     (sVar4 = psVar58[bVar12], (iVar50 >> 0x10 & (int)sVar4) == 0))
                                  {
                                    sVar8 = (short)((uint)iVar50 >> 0x10);
                                    if (sVar4 < 1) {
                                      sVar8 = -sVar8;
                                    }
                                    psVar58[bVar12] = sVar4 + sVar8;
                                  }
                                  uVar54 = uVar42 + 1;
                                }
                                bVar60 = uVar24 != 0;
                                uVar24 = uVar24 - 1;
                                uVar54 = uVar42 + 1;
                              } while (bVar60);
                              psVar58[bVar12] = sVar39;
                              uVar42 = uVar42 + 1;
LAB_0017f1fc:
                            } while ((int)uVar42 <= iVar55);
                          }
                          else {
                            psVar31->eob_run = iVar55 + -1;
                            uVar19 = (0x10000 << (bVar16 & 0x1f)) >> 0x10;
                            for (; (long)uVar42 <= (long)psVar31->spec_end; uVar42 = uVar42 + 1) {
                              bVar16 = ""[uVar42];
                              if (((psVar58[bVar16] != 0) &&
                                  (iVar50 = stbi__jpeg_get_bit(psVar31), iVar50 != 0)) &&
                                 (sVar39 = psVar58[bVar16], (uVar19 & (int)sVar39) == 0)) {
                                uVar24 = -uVar19;
                                if (0 < sVar39) {
                                  uVar24 = uVar19;
                                }
                                psVar58[bVar16] = (short)uVar24 + sVar39;
                              }
                            }
                          }
                        }
                        iVar50 = psVar31->todo;
                        psVar31->todo = iVar50 + -1;
                        if (iVar50 < 2) {
                          if (psVar31->code_bits < 0x18) {
                            stbi__grow_buffer_unsafe(psVar31);
                          }
                          bVar16 = psVar31->marker;
                          if ((bVar16 & 0xf8) != 0xd0) goto LAB_0017f7df;
                          stbi__jpeg_reset(psVar31);
                        }
                      }
                    }
                  }
                  else {
                    for (iVar17 = 0; iVar17 < psVar31->img_mcu_y; iVar17 = iVar17 + 1) {
                      for (iVar21 = 0; iVar21 < psVar31->img_mcu_x; iVar21 = iVar21 + 1) {
                        for (lVar38 = 0; lVar38 < psVar31->scan_n; lVar38 = lVar38 + 1) {
                          iVar41 = psVar31->order[lVar38];
                          for (iVar40 = 0; iVar40 < paVar1[iVar41].v; iVar40 = iVar40 + 1) {
                            iVar45 = 0;
                            while (iVar45 < paVar1[iVar41].h) {
                              iVar50 = stbi__jpeg_decode_block_prog_dc
                                                 (psVar31,paVar1[iVar41].coeff +
                                                          (paVar1[iVar41].h * iVar21 + iVar45 +
                                                          (paVar1[iVar41].v * iVar17 + iVar40) *
                                                          paVar1[iVar41].coeff_w) * 0x40,
                                                  (stbi__huffman *)
                                                  psVar31->huff_dc[paVar1[iVar41].hd].fast,iVar41);
                              iVar45 = iVar45 + 1;
                              if (iVar50 == 0) goto LAB_001807c7;
                            }
                          }
                        }
                        iVar41 = psVar31->todo;
                        psVar31->todo = iVar41 + -1;
                        if (iVar41 < 2) {
                          if (psVar31->code_bits < 0x18) {
                            stbi__grow_buffer_unsafe(psVar31);
                          }
                          bVar16 = psVar31->marker;
                          if ((bVar16 & 0xf8) != 0xd0) goto LAB_0017f7df;
                          stbi__jpeg_reset(psVar31);
                        }
                      }
                    }
                  }
                  goto LAB_0017f7d8;
                }
                if (psVar31->scan_n == 1) {
                  iVar17 = psVar31->order[0];
                  uVar19 = psVar31->img_comp[iVar17].x + 7 >> 3;
                  iVar21 = psVar31->img_comp[iVar17].y + 7 >> 3;
                  if ((int)uVar19 < 1) {
                    uVar19 = 0;
                  }
                  iVar41 = 0;
                  if (iVar21 < 1) {
                    iVar21 = 0;
                  }
                  for (iVar40 = 0; iVar40 != iVar21; iVar40 = iVar40 + 1) {
                    for (lVar38 = 0; (ulong)uVar19 * 8 != lVar38; lVar38 = lVar38 + 8) {
                      iVar45 = stbi__jpeg_decode_block
                                         (psVar31,(short *)pal,
                                          (stbi__huffman *)psVar31->huff_dc[paVar1[iVar17].hd].fast,
                                          (stbi__huffman *)psVar31->huff_ac[paVar1[iVar17].ha].fast,
                                          psVar31->fast_ac[paVar1[iVar17].ha],iVar17,
                                          psVar31->dequant[paVar1[iVar17].tq]);
                      if (iVar45 == 0) {
                        bVar60 = false;
                        goto LAB_0017f7d0;
                      }
                      (*psVar31->idct_block_kernel)
                                (paVar1[iVar17].data + lVar38 + iVar41 * paVar1[iVar17].w2,
                                 paVar1[iVar17].w2,(short *)pal);
                      iVar45 = psVar31->todo;
                      psVar31->todo = iVar45 + -1;
                      if (iVar45 < 2) {
                        if (psVar31->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(psVar31);
                        }
                        if ((psVar31->marker & 0xf8) != 0xd0) goto LAB_0017f7cd;
                        stbi__jpeg_reset(psVar31);
                      }
                    }
                    iVar41 = iVar41 + 8;
                  }
LAB_0017f7cd:
                  bVar60 = true;
                }
                else {
                  for (iVar17 = 0; iVar17 < psVar31->img_mcu_y; iVar17 = iVar17 + 1) {
                    for (iVar21 = 0; iVar21 < psVar31->img_mcu_x; iVar21 = iVar21 + 1) {
                      for (lVar38 = 0; lVar38 < psVar31->scan_n; lVar38 = lVar38 + 1) {
                        iVar41 = psVar31->order[lVar38];
                        for (iVar40 = 0; iVar40 < paVar1[iVar41].v; iVar40 = iVar40 + 1) {
                          for (iVar45 = 0; iVar50 = paVar1[iVar41].h, iVar45 < iVar50;
                              iVar45 = iVar45 + 1) {
                            iVar55 = paVar1[iVar41].v;
                            iVar53 = stbi__jpeg_decode_block
                                               (psVar31,(short *)pal,
                                                (stbi__huffman *)
                                                psVar31->huff_dc[paVar1[iVar41].hd].fast,
                                                (stbi__huffman *)
                                                psVar31->huff_ac[paVar1[iVar41].ha].fast,
                                                psVar31->fast_ac[paVar1[iVar41].ha],iVar41,
                                                psVar31->dequant[paVar1[iVar41].tq]);
                            if (iVar53 == 0) {
                              bVar60 = false;
                              goto LAB_0017f7d0;
                            }
                            (*psVar31->idct_block_kernel)
                                      (paVar1[iVar41].data +
                                       (long)((iVar50 * iVar21 + iVar45) * 8) +
                                       (long)((iVar55 * iVar17 + iVar40) * paVar1[iVar41].w2 * 8),
                                       paVar1[iVar41].w2,(short *)pal);
                          }
                        }
                      }
                      iVar41 = psVar31->todo;
                      psVar31->todo = iVar41 + -1;
                      if (iVar41 < 2) {
                        if (psVar31->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(psVar31);
                        }
                        if ((psVar31->marker & 0xf8) != 0xd0) goto LAB_0017f85a;
                        stbi__jpeg_reset(psVar31);
                      }
                    }
                  }
LAB_0017f85a:
                  bVar60 = true;
                }
LAB_0017f7d0:
                if (!bVar60) goto LAB_001807c7;
LAB_0017f7d8:
                bVar16 = psVar31->marker;
LAB_0017f7df:
                if (bVar16 == 0xff) {
                  while (iVar17 = stbi__at_eof(psVar31->s), iVar17 == 0) {
                    sVar10 = stbi__get8(psVar31->s);
                    while (sVar10 == 0xff) {
                      iVar17 = stbi__at_eof(psVar31->s);
                      if (iVar17 != 0) goto LAB_0017f827;
                      sVar10 = stbi__get8(psVar31->s);
                      if ((byte)(sVar10 - 1) < 0xfe) goto LAB_0017f829;
                    }
                  }
LAB_0017f827:
                  sVar10 = 0xff;
LAB_0017f829:
                  psVar31->marker = sVar10;
                }
                bVar16 = stbi__get_marker(psVar31);
                if ((bVar16 & 0xf8) != 0xd0) goto LAB_0017ed22;
LAB_0017ed80:
                bVar16 = stbi__get_marker(psVar31);
                goto LAB_0017ed22;
              }
              uVar19 = (uint)bVar16;
              if (uVar19 == 0xdc) {
                iVar17 = stbi__get16be(psVar31->s);
                sVar18 = stbi__get16be(psVar31->s);
                if ((iVar17 != 4) || (sVar18 != psVar31->s->img_y)) goto LAB_001807b7;
                goto LAB_0017ed80;
              }
              if (uVar19 == 0xd9) {
                if (psVar31->progressive != 0) {
                  for (lVar38 = 0; lVar38 < psVar31->s->img_n; lVar38 = lVar38 + 1) {
                    uVar19 = psVar31->img_comp[lVar38].x + 7 >> 3;
                    iVar17 = psVar31->img_comp[lVar38].y + 7 >> 3;
                    uVar54 = 0;
                    uVar42 = (ulong)uVar19;
                    if ((int)uVar19 < 1) {
                      uVar42 = uVar54;
                    }
                    if (iVar17 < 1) {
                      iVar17 = 0;
                    }
                    while (iVar21 = (int)uVar54, iVar21 != iVar17) {
                      for (uVar54 = 0; uVar54 != uVar42; uVar54 = uVar54 + 1) {
                        psVar58 = paVar1[lVar38].coeff;
                        iVar40 = paVar1[lVar38].coeff_w * iVar21;
                        iVar41 = paVar1[lVar38].tq;
                        iVar45 = iVar40 + (int)uVar54;
                        for (lVar34 = 0; lVar34 != 0x40; lVar34 = lVar34 + 1) {
                          psVar58[iVar45 * 0x40 + lVar34] =
                               psVar58[iVar45 * 0x40 + lVar34] * psVar31->dequant[iVar41][lVar34];
                        }
                        (*psVar31->idct_block_kernel)
                                  (paVar1[lVar38].data +
                                   uVar54 * 8 + (long)(iVar21 * 8 * paVar1[lVar38].w2),
                                   paVar1[lVar38].w2,psVar58 + (iVar40 + (int)uVar54) * 0x40);
                      }
                      uVar54 = (ulong)(iVar21 + 1);
                    }
                  }
                }
              }
              else {
                iVar17 = stbi__process_marker(psVar31,uVar19);
                if (iVar17 != 0) goto LAB_0017ed80;
              }
              psVar44 = psVar31->s;
              uVar19 = psVar44->img_n;
              uVar24 = (2 < (int)uVar19) + 1 + (uint)(2 < (int)uVar19);
              if (req_comp != 0) {
                uVar24 = req_comp;
              }
              if (uVar19 == 3) {
                bVar60 = true;
                if (psVar31->rgb != 3) {
                  if (psVar31->app14_color_transform == 0) {
                    bVar60 = psVar31->jfif == 0;
                  }
                  else {
                    bVar60 = false;
                  }
                }
              }
              else {
                bVar60 = false;
              }
              uVar27 = 1;
              if (bVar60) {
                uVar27 = uVar19;
              }
              if (2 < (int)uVar24) {
                uVar27 = uVar19;
              }
              if (uVar19 != 3) {
                uVar27 = uVar19;
              }
              if (0 < (int)uVar27) {
                _value = (stbi_uc *)0x0;
                sVar18 = psVar44->img_x;
                for (lVar38 = 0; (ulong)uVar27 * 0x30 != lVar38; lVar38 = lVar38 + 0x30) {
                  pvVar29 = malloc((ulong)(sVar18 + 3));
                  *(void **)((long)&psVar31->img_comp[0].linebuf + lVar38 * 2) = pvVar29;
                  if (pvVar29 == (void *)0x0) goto LAB_00181326;
                  uVar42 = (long)psVar31->img_h_max /
                           (long)*(int *)((long)&psVar31->img_comp[0].h + lVar38 * 2);
                  iVar17 = (int)uVar42;
                  *(int *)(pal[6] + lVar38) = iVar17;
                  iVar21 = psVar31->img_v_max / *(int *)((long)&psVar31->img_comp[0].v + lVar38 * 2)
                  ;
                  *(int *)(pal[7] + lVar38) = iVar21;
                  *(int *)(pal[9] + lVar38) = iVar21 >> 1;
                  *(int *)(pal[8] + lVar38) =
                       (int)((ulong)(iVar17 + (sVar18 - 1)) / (uVar42 & 0xffffffff));
                  psVar59 = pal[10] + lVar38;
                  psVar59[0] = '\0';
                  psVar59[1] = '\0';
                  psVar59[2] = '\0';
                  psVar59[3] = '\0';
                  uVar37 = *(undefined8 *)((long)&psVar31->img_comp[0].data + lVar38 * 2);
                  *(undefined8 *)(pal[4] + lVar38) = uVar37;
                  *(undefined8 *)(pal[2] + lVar38) = uVar37;
                  if (iVar17 == 2) {
                    pcVar36 = stbi__resample_row_h_2;
                    if (iVar21 != 1) {
                      if (iVar21 != 2) goto LAB_00180cdc;
                      pcVar36 = psVar31->resample_row_hv_2_kernel;
                    }
                  }
                  else if (iVar17 == 1) {
                    pcVar36 = stbi__resample_row_generic;
                    if (iVar21 == 2) {
                      pcVar36 = stbi__resample_row_v_2;
                    }
                    if (iVar21 == 1) {
                      pcVar36 = resample_row_1;
                    }
                  }
                  else {
LAB_00180cdc:
                    pcVar36 = stbi__resample_row_generic;
                  }
                  *(code **)(pal[0] + lVar38) = pcVar36;
                }
                sVar20 = psVar44->img_y;
                psVar30 = (stbi__context *)stbi__malloc_mad3(uVar24,sVar18,sVar20,1);
                if (psVar30 == (stbi__context *)0x0) {
LAB_00181326:
                  stbi__cleanup_jpeg(psVar31);
                  *(char **)(in_FS_OFFSET + -0x20) = "Out of memory";
                  psVar30 = (stbi__context *)0x0;
                }
                else {
                  iVar17 = 0;
                  for (uVar19 = 0; uVar19 < sVar20; uVar19 = uVar19 + 1) {
                    sVar18 = psVar44->img_x;
                    psVar59 = value;
                    for (lVar38 = 0; (ulong)uVar27 * 0x30 != lVar38; lVar38 = lVar38 + 0x30) {
                      iVar21 = *(int *)(pal[9] + lVar38);
                      iVar41 = *(int *)(pal[7] + lVar38);
                      iVar40 = iVar41 >> 1;
                      psVar57 = pal[4] + lVar38;
                      if (iVar21 < iVar40) {
                        psVar57 = pal[2] + lVar38;
                      }
                      psVar33 = pal[4] + lVar38;
                      if (iVar40 <= iVar21) {
                        psVar33 = pal[2] + lVar38;
                      }
                      uVar37 = (**(code **)(pal[0] + lVar38))
                                         (*(undefined8 *)
                                           ((long)&psVar31->img_comp[0].linebuf + lVar38 * 2),
                                          *(undefined8 *)psVar57,*(undefined8 *)psVar33,
                                          *(undefined4 *)(pal[8] + lVar38));
                      *(undefined8 *)psVar59 = uVar37;
                      *(int *)(pal[9] + lVar38) = iVar21 + 1;
                      if (iVar41 <= iVar21 + 1) {
                        psVar57 = pal[9] + lVar38;
                        psVar57[0] = '\0';
                        psVar57[1] = '\0';
                        psVar57[2] = '\0';
                        psVar57[3] = '\0';
                        lVar34 = *(long *)(pal[4] + lVar38);
                        *(long *)(pal[2] + lVar38) = lVar34;
                        iVar21 = *(int *)(pal[10] + lVar38) + 1;
                        *(int *)(pal[10] + lVar38) = iVar21;
                        if (iVar21 < *(int *)((long)&psVar31->img_comp[0].y + lVar38 * 2)) {
                          *(long *)(pal[4] + lVar38) =
                               lVar34 + *(int *)((long)&psVar31->img_comp[0].w2 + lVar38 * 2);
                        }
                      }
                      psVar59 = psVar59 + 8;
                    }
                    if ((int)uVar24 < 3) {
                      psVar44 = psVar31->s;
                      if (bVar60) {
                        psVar59 = psVar30->buffer_start + ((ulong)(sVar18 * iVar17) - 0x38);
                        pbVar48 = (byte *)0x0;
                        if (uVar24 == 1) {
                          for (; pbVar48 < (byte *)(ulong)psVar44->img_x; pbVar48 = pbVar48 + 1) {
                            psVar59[(long)pbVar48] =
                                 (stbi_uc)((uint)*pbVar48 * 0x1d +
                                           (uint)*pbVar48 * 0x96 +
                                           (uint)_value[(long)pbVar48] * 0x4d >> 8);
                          }
                        }
                        else {
                          for (; pbVar48 < (byte *)(ulong)psVar44->img_x; pbVar48 = pbVar48 + 1) {
                            psVar59[(long)pbVar48 * 2] =
                                 (stbi_uc)((uint)*pbVar48 * 0x1d +
                                           (uint)*pbVar48 * 0x96 +
                                           (uint)_value[(long)pbVar48] * 0x4d >> 8);
                            psVar59[(long)pbVar48 * 2 + 1] = 0xff;
                          }
                        }
                      }
                      else if (psVar44->img_n == 4) {
                        if (psVar31->app14_color_transform == 2) {
                          psVar59 = psVar30->buffer_start + ((ulong)(sVar18 * iVar17) - 0x37);
                          for (pbVar48 = (byte *)0x0; pbVar48 < (byte *)(ulong)psVar44->img_x;
                              pbVar48 = pbVar48 + 1) {
                            iVar21 = (_value[(long)pbVar48] ^ 0xff) * (uint)*pbVar48;
                            psVar59[-1] = (char)((iVar21 + 0x80U >> 8) + iVar21 + 0x80 >> 8);
                            *psVar59 = 0xff;
                            psVar59 = psVar59 + uVar24;
                          }
                        }
                        else {
                          if (psVar31->app14_color_transform != 0) goto LAB_0018116c;
                          psVar59 = psVar30->buffer_start + ((ulong)(sVar18 * iVar17) - 0x37);
                          for (pbVar48 = (byte *)0x0; pbVar48 < (byte *)(ulong)psVar44->img_x;
                              pbVar48 = pbVar48 + 1) {
                            bVar16 = *pbVar48;
                            iVar21 = (uint)_value[(long)pbVar48] * (uint)bVar16;
                            iVar41 = (uint)*pbVar48 * (uint)bVar16;
                            psVar59[-1] = (char)((((uint)*pbVar48 * (uint)bVar16 + 0x80 >> 8) +
                                                  (uint)*pbVar48 * (uint)bVar16 + 0x80 >> 8) * 0x1d
                                                 + (iVar41 + (iVar41 + 0x80U >> 8) + 0x80 >> 8) *
                                                   0x96 + (iVar21 + (iVar21 + 0x80U >> 8) + 0x80 >>
                                                          8) * 0x4d >> 8);
                            *psVar59 = 0xff;
                            psVar59 = psVar59 + uVar24;
                          }
                        }
                      }
                      else {
LAB_0018116c:
                        uVar25 = sVar18 * iVar17;
                        uVar42 = 0;
                        if (uVar24 == 1) {
                          for (; uVar42 < psVar44->img_x; uVar42 = uVar42 + 1) {
                            psVar30->buffer_start[uVar42 + uVar25 + -0x38] = _value[uVar42];
                          }
                        }
                        else {
                          for (; uVar42 < psVar44->img_x; uVar42 = uVar42 + 1) {
                            psVar30->buffer_start[uVar42 * 2 + (ulong)uVar25 + -0x38] =
                                 _value[uVar42];
                            psVar30->buffer_start[uVar42 * 2 + (ulong)uVar25 + -0x37] = 0xff;
                          }
                        }
                      }
                    }
                    else {
                      psVar44 = psVar31->s;
                      if (psVar44->img_n == 3) {
                        if (bVar60) {
                          psVar59 = psVar30->buffer_start + ((ulong)(sVar18 * iVar17) - 0x35);
                          for (puVar46 = (undefined1 *)0x0;
                              puVar46 < (undefined1 *)(ulong)psVar44->img_x; puVar46 = puVar46 + 1)
                          {
                            psVar59[-3] = _value[(long)puVar46];
                            psVar59[-2] = *puVar46;
                            psVar59[-1] = *puVar46;
                            *psVar59 = 0xff;
                            psVar59 = psVar59 + uVar24;
                          }
                        }
                        else {
LAB_001811ba:
                          (*psVar31->YCbCr_to_RGB_kernel)
                                    (psVar30->buffer_start +
                                     ((ulong)(uVar19 * uVar24 * sVar18) - 0x38),_value,
                                     (stbi_uc *)0x0,(stbi_uc *)0x0,psVar44->img_x,uVar24);
                        }
                      }
                      else if (psVar44->img_n == 4) {
                        if (psVar31->app14_color_transform == 2) {
                          (*psVar31->YCbCr_to_RGB_kernel)
                                    (psVar30->buffer_start +
                                     ((ulong)(uVar19 * uVar24 * sVar18) - 0x38),_value,
                                     (stbi_uc *)0x0,(stbi_uc *)0x0,psVar44->img_x,uVar24);
                          psVar44 = psVar31->s;
                          psVar59 = psVar30->buffer_start + ((ulong)(sVar18 * iVar17) - 0x36);
                          for (pbVar48 = (byte *)0x0; pbVar48 < (byte *)(ulong)psVar44->img_x;
                              pbVar48 = pbVar48 + 1) {
                            bVar16 = *pbVar48;
                            iVar21 = (psVar59[-2] ^ 0xff) * (uint)bVar16;
                            psVar59[-2] = (byte)((iVar21 + 0x80U >> 8) + iVar21 + 0x80 >> 8);
                            iVar21 = (psVar59[-1] ^ 0xff) * (uint)bVar16;
                            psVar59[-1] = (byte)((iVar21 + 0x80U >> 8) + iVar21 + 0x80 >> 8);
                            iVar21 = (*psVar59 ^ 0xff) * (uint)bVar16;
                            *psVar59 = (byte)((iVar21 + 0x80U >> 8) + iVar21 + 0x80 >> 8);
                            psVar59 = psVar59 + uVar24;
                          }
                        }
                        else {
                          if (psVar31->app14_color_transform != 0) goto LAB_001811ba;
                          psVar59 = psVar30->buffer_start + ((ulong)(sVar18 * iVar17) - 0x35);
                          for (pbVar48 = (byte *)0x0; pbVar48 < (byte *)(ulong)psVar44->img_x;
                              pbVar48 = pbVar48 + 1) {
                            bVar16 = *pbVar48;
                            iVar21 = (uint)_value[(long)pbVar48] * (uint)bVar16;
                            psVar59[-3] = (char)((iVar21 + 0x80U >> 8) + iVar21 + 0x80 >> 8);
                            iVar21 = (uint)*pbVar48 * (uint)bVar16;
                            psVar59[-2] = (char)((iVar21 + 0x80U >> 8) + iVar21 + 0x80 >> 8);
                            psVar59[-1] = (char)(((uint)*pbVar48 * (uint)bVar16 + 0x80 >> 8) +
                                                 (uint)*pbVar48 * (uint)bVar16 + 0x80 >> 8);
                            *psVar59 = 0xff;
                            psVar59 = psVar59 + uVar24;
                          }
                        }
                      }
                      else {
                        psVar59 = psVar30->buffer_start + ((ulong)(sVar18 * iVar17) - 0x35);
                        for (uVar42 = 0; uVar42 < psVar44->img_x; uVar42 = uVar42 + 1) {
                          sVar10 = _value[uVar42];
                          psVar59[-1] = sVar10;
                          psVar59[-2] = sVar10;
                          psVar59[-3] = sVar10;
                          *psVar59 = 0xff;
                          psVar59 = psVar59 + uVar24;
                        }
                      }
                    }
                    psVar44 = psVar31->s;
                    sVar20 = psVar44->img_y;
                    iVar17 = iVar17 + uVar24;
                  }
                  stbi__cleanup_jpeg(psVar31);
                  psVar44 = psVar31->s;
                  *x = psVar44->img_x;
                  *y = psVar44->img_y;
                  if (comp != (int *)0x0) {
                    *comp = (uint)(2 < psVar44->img_n) * 2 + 1;
                  }
                }
                goto LAB_0017e2e5;
              }
            }
LAB_001807c7:
            stbi__cleanup_jpeg(psVar31);
          }
          else {
            *(char **)(in_FS_OFFSET + -0x20) = "Internal error";
          }
          psVar30 = (stbi__context *)0x0;
LAB_0017e2e5:
          free(psVar31);
          return psVar30;
        }
        goto LAB_0017f98e;
      }
    }
    sVar10 = stbi__get8(s);
    sVar11 = stbi__get8(s);
    if ((sVar10 == 'P') && (0xfd < (byte)(sVar11 - 0x37))) {
      y_00 = &s->img_y;
      comp_00 = &s->img_n;
      iVar17 = stbi__pnm_info(s,(int *)s,(int *)y_00,comp_00);
      ri->bits_per_channel = iVar17;
      if (iVar17 == 0) {
        return (void *)0x0;
      }
      if ((0x1000000 < *y_00) || (0x1000000 < s->img_x)) goto LAB_0017ea99;
      *x = s->img_x;
      sVar18 = *y_00;
      *y = sVar18;
      iVar17 = *comp_00;
      if (comp != (int *)0x0) {
        *comp = iVar17;
        sVar18 = *y_00;
      }
      sVar20 = s->img_x;
      iVar41 = ri->bits_per_channel / 8;
      iVar40 = stbi__mad4sizes_valid(iVar17,sVar20,sVar18,iVar41,iVar21);
      if (iVar40 == 0) {
        pcVar28 = "PNM too large";
        goto LAB_0017df0b;
      }
      psVar32 = (stbi__uint16 *)stbi__malloc_mad4(iVar17,sVar20,sVar18,iVar41,iVar21);
      if (psVar32 != (stbi__uint16 *)0x0) {
        iVar17 = stbi__getn(s,(stbi_uc *)psVar32,sVar18 * iVar17 * sVar20 * iVar41);
        if (iVar17 != 0) {
          if (req_comp == 0) {
            return psVar32;
          }
          iVar17 = *comp_00;
          if (iVar17 != req_comp) {
            if (ri->bits_per_channel == 0x10) {
              psVar32 = stbi__convert_format16(psVar32,iVar17,req_comp,s->img_x,s->img_y);
              return psVar32;
            }
            puVar35 = stbi__convert_format((uchar *)psVar32,iVar17,req_comp,s->img_x,s->img_y);
            return puVar35;
          }
          return psVar32;
        }
        free(psVar32);
        pcVar28 = "PNM file truncated";
        goto LAB_0017df0b;
      }
    }
    else {
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      iVar17 = stbi__hdr_test(s);
      if (iVar17 == 0) {
        stbi__get8(s);
        bVar16 = stbi__get8(s);
        if (bVar16 < 2) {
          bVar12 = stbi__get8(s);
          if (bVar16 == 1) {
            if ((bVar12 & 0xf7) == 1) {
              iVar17 = 4;
              stbi__skip(s,4);
              bVar12 = stbi__get8(s);
              if ((bVar12 < 0x21) && ((0x101018100U >> ((ulong)bVar12 & 0x3f) & 1) != 0))
              goto LAB_0017f9a8;
            }
            goto LAB_0017f876;
          }
          if ((bVar12 & 0xf6) != 2) goto LAB_0017f876;
          iVar17 = 9;
LAB_0017f9a8:
          stbi__skip(s,iVar17);
          iVar17 = stbi__get16le(s);
          if ((iVar17 == 0) || (iVar17 = stbi__get16le(s), iVar17 == 0)) goto LAB_0017f876;
          bVar12 = stbi__get8(s);
          if (bVar16 != 1) {
            if ((bVar12 < 0x21) && ((0x101018100U >> ((ulong)bVar12 & 0x3f) & 1) != 0)) {
              s->img_buffer = s->img_buffer_original;
              s->img_buffer_end = s->img_buffer_original_end;
              goto LAB_0017fd7a;
            }
            goto LAB_0017f876;
          }
          s->img_buffer = s->img_buffer_original;
          s->img_buffer_end = s->img_buffer_original_end;
          if ((bVar12 - 8 & 0xf7) == 0) {
LAB_0017fd7a:
            bVar12 = stbi__get8(s);
            sVar10 = stbi__get8(s);
            bVar13 = stbi__get8(s);
            iVar17 = stbi__get16le(s);
            uVar25 = stbi__get16le(s);
            bVar16 = stbi__get8(s);
            stbi__get16le(s);
            stbi__get16le(s);
            uVar19 = stbi__get16le(s);
            uVar24 = stbi__get16le(s);
            bVar14 = stbi__get8(s);
            pal._0_8_ = (ulong)(uint)pal[1] << 0x20;
            bVar15 = stbi__get8(s);
            _value = (stbi_uc *)((ulong)_value & 0xffffffff00000000);
            if (sVar10 == '\0') {
              uVar27 = bVar13 - 8;
              if (bVar13 < 8) {
                uVar27 = (uint)bVar13;
              }
              uVar27 = (uint)(uVar27 == 3);
              bVar16 = bVar14;
            }
            else {
              uVar27 = 0;
            }
            uVar27 = stbi__tga_get_comp((uint)bVar16,uVar27,(int *)pal);
            if (uVar27 == 0) {
              pcVar28 = "Can\'t find out TGA pixelformat";
              goto LAB_0017df0b;
            }
            *x = uVar19;
            *y = uVar24;
            if (comp != (int *)0x0) {
              *comp = uVar27;
            }
            iVar21 = stbi__mad3sizes_valid(uVar19,uVar24,uVar27,0);
            if (iVar21 != 0) {
              local_8978 = (float *)stbi__malloc_mad3(uVar19,uVar24,uVar27,0);
              if (local_8978 == (float *)0x0) goto LAB_0017f98e;
              stbi__skip(s,(uint)bVar12);
              uVar42 = (ulong)uVar27;
              if (((sVar10 == '\0') && (bVar13 < 8)) && (pal[0] == (stbi_uc  [4])0x0)) {
                uVar56 = 0;
                uVar25 = uVar24;
                while (uVar25 = uVar25 - 1, uVar25 != 0xffffffff) {
                  uVar51 = uVar56;
                  if ((bVar15 >> 5 & 1) == 0) {
                    uVar51 = uVar25;
                  }
                  stbi__getn(s,(stbi_uc *)((long)local_8978 + (long)(int)(uVar51 * uVar27 * uVar19))
                             ,uVar27 * uVar19);
                  uVar56 = uVar56 + 1;
                }
              }
              else {
                if (sVar10 == '\0') {
                  local_8968 = (float *)0x0;
                }
                else {
                  if (uVar25 == 0) {
LAB_00181586:
                    free(local_8978);
                    goto LAB_0018158b;
                  }
                  stbi__skip(s,iVar17);
                  local_8968 = (float *)stbi__malloc_mad2(uVar25,uVar27,0);
                  if (local_8968 == (float *)0x0) goto LAB_0017f989;
                  if (pal[0] == (stbi_uc  [4])0x0) {
                    iVar17 = stbi__getn(s,(stbi_uc *)local_8968,uVar27 * uVar25);
                    if (iVar17 == 0) {
                      free(local_8978);
                      local_8978 = local_8968;
                      goto LAB_00181586;
                    }
                  }
                  else {
                    if (uVar27 != 3) {
                      __assert_fail("tga_comp == STBI_rgb",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/flowkey[P]sdl-gpu/src/externals/stb_image/stb_image.h"
                                    ,0x1746,
                                    "void *stbi__tga_load(stbi__context *, int *, int *, int *, int, stbi__result_info *)"
                                   );
                    }
                    for (lVar38 = 0; uVar25 * 3 != (int)lVar38; lVar38 = lVar38 + 3) {
                      stbi__tga_read_rgb16(s,(stbi_uc *)((long)local_8968 + lVar38));
                    }
                  }
                }
                bVar60 = true;
                iVar17 = 0;
                uVar56 = 0;
                pfVar49 = local_8978;
                for (uVar54 = 0; uVar54 != uVar24 * uVar19; uVar54 = uVar54 + 1) {
                  if (bVar13 < 8) {
LAB_001813e7:
                    if (sVar10 == '\0') {
                      if (pal[0] == (stbi_uc  [4])0x0) {
                        for (uVar43 = 0; uVar42 != uVar43; uVar43 = uVar43 + 1) {
                          sVar11 = stbi__get8(s);
                          value[uVar43] = sVar11;
                        }
                      }
                      else {
                        if (uVar27 != 3) {
                          __assert_fail("tga_comp == STBI_rgb",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/flowkey[P]sdl-gpu/src/externals/stb_image/stb_image.h"
                                        ,0x1777,
                                        "void *stbi__tga_load(stbi__context *, int *, int *, int *, int, stbi__result_info *)"
                                       );
                        }
                        stbi__tga_read_rgb16(s,value);
                      }
                    }
                    else {
                      if (bVar14 == 8) {
                        bVar16 = stbi__get8(s);
                        uVar51 = (uint)bVar16;
                      }
                      else {
                        uVar51 = stbi__get16le(s);
                      }
                      if (uVar25 <= uVar51) {
                        uVar51 = 0;
                      }
                      for (uVar43 = 0; uVar42 != uVar43; uVar43 = uVar43 + 1) {
                        value[uVar43] = *(stbi_uc *)((long)local_8968 + uVar43 + uVar51 * uVar27);
                      }
                    }
                  }
                  else {
                    if (iVar17 == 0) {
                      bVar16 = stbi__get8(s);
                      iVar17 = (bVar16 & 0x7f) + 1;
                      uVar56 = (uint)(bVar16 >> 7);
                      goto LAB_001813e7;
                    }
                    if (uVar56 == 0 || bVar60) {
                      uVar56 = (uint)(uVar56 != 0);
                      goto LAB_001813e7;
                    }
                    uVar56 = 1;
                  }
                  for (uVar43 = 0; uVar42 != uVar43; uVar43 = uVar43 + 1) {
                    *(stbi_uc *)((long)pfVar49 + uVar43) = value[uVar43];
                  }
                  iVar17 = iVar17 + -1;
                  pfVar49 = (float *)((long)pfVar49 + uVar42);
                  bVar60 = false;
                }
                if ((bVar15 >> 5 & 1) == 0) {
                  iVar17 = uVar27 * uVar19;
                  iVar21 = (uVar24 - 1) * iVar17;
                  uVar25 = 0;
                  for (uVar56 = 0; uVar56 != uVar24 + 1 >> 1; uVar56 = uVar56 + 1) {
                    pfVar49 = local_8978;
                    for (iVar41 = iVar17; 0 < iVar41; iVar41 = iVar41 + -1) {
                      uVar3 = *(undefined1 *)((long)pfVar49 + (ulong)uVar25);
                      *(undefined1 *)((long)pfVar49 + (ulong)uVar25) =
                           *(undefined1 *)((long)pfVar49 + (long)iVar21);
                      *(undefined1 *)((long)pfVar49 + (long)iVar21) = uVar3;
                      pfVar49 = (float *)((long)pfVar49 + 1);
                    }
                    uVar25 = uVar25 + iVar17;
                    iVar21 = iVar21 - iVar17;
                  }
                }
                free(local_8968);
              }
              if ((2 < uVar27) && (pal[0] == (stbi_uc  [4])0x0)) {
                iVar17 = uVar24 * uVar19;
                puVar46 = (undefined1 *)((long)local_8978 + 2);
                while (bVar60 = iVar17 != 0, iVar17 = iVar17 + -1, bVar60) {
                  uVar3 = puVar46[-2];
                  puVar46[-2] = *puVar46;
                  *puVar46 = uVar3;
                  puVar46 = puVar46 + uVar42;
                }
              }
              if (req_comp == 0) {
                return local_8978;
              }
              if (uVar27 == req_comp) {
                return local_8978;
              }
LAB_001803c1:
              puVar35 = stbi__convert_format((uchar *)local_8978,uVar27,req_comp,uVar19,uVar24);
              return puVar35;
            }
LAB_0018158b:
            pcVar28 = "Corrupt TGA";
            goto LAB_0017df0b;
          }
        }
        else {
LAB_0017f876:
          s->img_buffer = s->img_buffer_original;
          s->img_buffer_end = s->img_buffer_original_end;
        }
        pcVar28 = "Image not of any known type, or corrupt";
        goto LAB_0017df0b;
      }
      local_8978 = stbi__hdr_load(s,x,y,comp,req_comp,ri_00);
      if (req_comp == 0) {
        req_comp = *comp;
      }
      if (local_8978 == (float *)0x0) {
        return (void *)0x0;
      }
      iVar17 = *x;
      iVar21 = *y;
      pvVar29 = stbi__malloc_mad3(iVar17,iVar21,req_comp,0);
      if (pvVar29 != (void *)0x0) {
        uVar19 = (req_comp + (req_comp & 1U)) - 1;
        uVar24 = iVar21 * iVar17;
        if ((int)uVar19 < 1) {
          uVar19 = 0;
        }
        lVar38 = (long)req_comp;
        uVar42 = (ulong)uVar24;
        if ((int)uVar24 < 1) {
          uVar42 = 0;
        }
        pvVar52 = pvVar29;
        pfVar49 = local_8978;
        for (uVar54 = 0; uVar54 != uVar42; uVar54 = uVar54 + 1) {
          for (uVar43 = 0; uVar19 != uVar43; uVar43 = uVar43 + 1) {
            dVar6 = pow((double)(pfVar49[uVar43] * stbi__h2l_scale_i),(double)stbi__h2l_gamma_i);
            fVar62 = (float)dVar6 * 255.0 + 0.5;
            fVar61 = 0.0;
            if (0.0 <= fVar62) {
              fVar61 = fVar62;
            }
            fVar62 = 255.0;
            if (fVar61 <= 255.0) {
              fVar62 = fVar61;
            }
            *(char *)((long)pvVar52 + uVar43) = (char)(int)fVar62;
          }
          if ((int)uVar19 < req_comp) {
            lVar34 = uVar54 * lVar38 + (ulong)uVar19;
            fVar62 = local_8978[lVar34] * 255.0 + 0.5;
            fVar61 = 0.0;
            if (0.0 <= fVar62) {
              fVar61 = fVar62;
            }
            fVar62 = 255.0;
            if (fVar61 <= 255.0) {
              fVar62 = fVar61;
            }
            *(char *)((long)pvVar29 + lVar34) = (char)(int)fVar62;
          }
          pvVar52 = (void *)((long)pvVar52 + lVar38);
          pfVar49 = pfVar49 + lVar38;
        }
        free(local_8978);
        return pvVar29;
      }
LAB_0017f989:
      free(local_8978);
    }
  }
LAB_0017f98e:
  pcVar28 = "Out of memory";
LAB_0017df0b:
  *(char **)(in_FS_OFFSET + -0x20) = pcVar28;
  return (void *)0x0;
code_r0x0017e801:
  uVar27 = 4 - ((uVar25 & 0x10) == 0);
  if (comp != (int *)0x0) {
    *comp = uVar27;
  }
  for (uVar42 = 0; uVar42 != uVar24; uVar42 = uVar42 + 1) {
    psVar59 = (stbi_uc *)((long)local_8978 + (long)(int)(uVar19 * 4 * (int)uVar42));
    for (lVar34 = 0; lVar38 != lVar34; lVar34 = lVar34 + 1) {
      lVar7 = lVar34 * 3;
      sVar10 = pal[0][lVar7 + 1];
      psVar57 = psVar59;
      uVar25 = uVar19;
      if (sVar10 == '\0') {
        while (bVar60 = uVar25 != 0, uVar25 = uVar25 - 1, bVar60) {
          psVar33 = stbi__readval(s,(uint)pal[0][lVar7 + 2],psVar57);
          if (psVar33 == (stbi_uc *)0x0) goto LAB_00180371;
          psVar57 = psVar57 + 4;
        }
      }
      else if (sVar10 == '\x01') {
        for (; 0 < (int)uVar25; uVar25 = uVar25 - (uVar56 & 0xff)) {
          bVar16 = stbi__get8(s);
          iVar17 = stbi__at_eof(s);
          if (iVar17 != 0) {
            pcVar28 = "file too short (pure read count)";
            goto LAB_0018035f;
          }
          psVar33 = stbi__readval(s,(uint)pal[0][lVar7 + 2],value);
          if (psVar33 == (stbi_uc *)0x0) goto LAB_00180371;
          uVar56 = (uint)bVar16;
          if (uVar25 < bVar16) {
            uVar56 = uVar25;
          }
          uVar51 = uVar56 & 0xff;
          while (bVar60 = uVar51 != 0, uVar51 = uVar51 - 1, bVar60) {
            stbi__copyval((uint)pal[0][lVar7 + 2],psVar57,value);
            psVar57 = psVar57 + 4;
          }
        }
      }
      else {
        if (sVar10 != '\x02') {
          pcVar28 = "packet has bad compression type";
LAB_0018134f:
          *(char **)(in_FS_OFFSET + -0x20) = pcVar28;
          goto LAB_00180371;
        }
        for (; 0 < (int)uVar25; uVar25 = uVar25 - iVar21) {
          bVar16 = stbi__get8(s);
          iVar17 = stbi__at_eof(s);
          if (iVar17 != 0) {
            pcVar28 = "file too short (mixed read count)";
LAB_0018035f:
            *(char **)(in_FS_OFFSET + -0x20) = pcVar28;
            goto LAB_00180371;
          }
          uVar56 = (uint)bVar16;
          if ((char)bVar16 < '\0') {
            if (uVar56 == 0x80) {
              iVar21 = stbi__get16be(s);
            }
            else {
              iVar21 = uVar56 - 0x7f;
            }
            if ((int)uVar25 < iVar21) {
LAB_001809ca:
              pcVar28 = "scanline overrun";
              goto LAB_0018134f;
            }
            psVar33 = stbi__readval(s,(uint)pal[0][lVar7 + 2],value);
            iVar17 = iVar21;
            if (psVar33 == (stbi_uc *)0x0) goto LAB_00180371;
            while (iVar17 != 0) {
              stbi__copyval((uint)pal[0][lVar7 + 2],psVar57,value);
              psVar57 = psVar57 + 4;
              iVar17 = iVar17 + -1;
            }
          }
          else {
            iVar21 = bVar16 + 1;
            iVar17 = iVar21;
            if (uVar25 <= uVar56) goto LAB_001809ca;
            while (bVar60 = iVar17 != 0, iVar17 = iVar17 + -1, bVar60) {
              psVar33 = stbi__readval(s,(uint)pal[0][lVar7 + 2],psVar57);
              if (psVar33 == (stbi_uc *)0x0) goto LAB_00180371;
              psVar57 = psVar57 + 4;
            }
          }
        }
      }
    }
  }
LAB_00180397:
  *x = uVar19;
  *y = uVar24;
  bVar60 = req_comp != 0;
  if (bVar60) {
    uVar27 = req_comp;
  }
  req_comp = uVar27;
  if (!bVar60 && comp != (int *)0x0) {
    req_comp = *comp;
  }
  uVar27 = 4;
  goto LAB_001803c1;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   // test the formats with a very explicit header first (at least a FOURCC
   // or distinctive magic number first)
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #else
   STBI_NOTUSED(bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif

   // then the formats that can end up attempting to load with just 1 or 2
   // bytes matching expectations; these are prone to false positives, so
   // try them later
   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}